

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

int mspace_trim(mspace msp,size_t pad)

{
  long lVar1;
  ulong *__addr;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ulong *puVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong __len;
  bool bVar10;
  bool bVar11;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (0xffffffffffffff7f < pad) {
    return 0;
  }
  uVar7 = *(ulong *)((long)msp + 0x28);
  if (uVar7 == 0) {
    return 0;
  }
  if (*(ulong *)((long)msp + 0x10) <= pad + 0x50) {
    __len = 0;
    goto LAB_0010433b;
  }
  __len = ((((*(ulong *)((long)msp + 0x10) - pad) + mparams.granularity) - 0x51) /
           mparams.granularity - 1) * mparams.granularity;
  puVar5 = (ulong *)((long)msp + 0x378);
  puVar9 = puVar5;
  do {
    if ((*puVar9 <= uVar7) && (uVar7 < *puVar9 + puVar9[1])) goto LAB_001042c0;
    puVar9 = (ulong *)puVar9[2];
  } while (puVar9 != (ulong *)0x0);
  puVar9 = (ulong *)0x0;
LAB_001042c0:
  if ((puVar9[3] & 9) == 1) {
    uVar7 = puVar9[1];
    if (uVar7 < __len) goto LAB_001042de;
    __addr = (ulong *)*puVar9;
    do {
      bVar10 = __addr <= puVar5;
      bVar11 = puVar5 < (ulong *)((long)__addr + uVar7);
      if (bVar11 && bVar10) goto LAB_001042de;
      puVar5 = (ulong *)puVar5[2];
    } while (puVar5 != (ulong *)0x0);
    if ((bVar11 && bVar10) ||
       ((pvVar6 = mremap(__addr,uVar7,uVar7 - __len,0), pvVar6 == (void *)0xffffffffffffffff &&
        (iVar2 = munmap((void *)((uVar7 - __len) + *puVar9),__len), iVar2 != 0))))
    goto LAB_001042de;
  }
  else {
LAB_001042de:
    __len = 0;
  }
  if (__len != 0) {
    puVar9[1] = puVar9[1] - __len;
    *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
    lVar1 = *(long *)((long)msp + 0x28);
    lVar3 = *(long *)((long)msp + 0x10) - __len;
    uVar7 = (ulong)(-(int)lVar1 - 0x10U & 0xf);
    uVar8 = lVar3 - uVar7;
    *(ulong *)((long)msp + 0x28) = lVar1 + uVar7;
    *(ulong *)((long)msp + 0x10) = uVar8;
    *(ulong *)(lVar1 + 8 + uVar7) = uVar8 | 1;
    *(undefined8 *)(lVar1 + 8 + lVar3) = 0x50;
    *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
  }
LAB_0010433b:
  sVar4 = release_unused_segments((mstate)msp);
  iVar2 = 1;
  if ((sVar4 + __len == 0) &&
     (iVar2 = 0, *(ulong *)((long)msp + 0x30) < *(ulong *)((long)msp + 0x10))) {
    *(undefined8 *)((long)msp + 0x30) = 0xffffffffffffffff;
  }
  return iVar2;
}

Assistant:

int mspace_trim(mspace msp, size_t pad) {
  int result = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    if (!PREACTION(ms)) {
      result = sys_trim(ms, pad);
      POSTACTION(ms);
    }
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return result;
}